

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall Psbt_EmptyObject_Test::Psbt_EmptyObject_Test(Psbt_EmptyObject_Test *this)

{
  Test *in_RDI;
  
  testing::Test::Test(in_RDI);
  in_RDI->_vptr_Test = (_func_int **)&PTR__Psbt_EmptyObject_Test_009f0550;
  return;
}

Assistant:

TEST(Psbt, EmptyObject) {
  try {
    Psbt empty_obj;
    EXPECT_EQ(2, empty_obj.GetTransaction().GetVersion());
    EXPECT_EQ(0, empty_obj.GetTransaction().GetLockTime());
    EXPECT_EQ(19, empty_obj.GetDataSize());
    EXPECT_STREQ("70736274ff01000a0200000000000000000000",
        empty_obj.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAAoCAAAAAAAAAAAAAA==", empty_obj.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    Psbt obj(1, 100);
    EXPECT_EQ(1, obj.GetTransaction().GetVersion());
    EXPECT_EQ(100, obj.GetTransaction().GetLockTime());
    EXPECT_EQ(19, obj.GetDataSize());
    EXPECT_STREQ("70736274ff01000a0100000000006400000000",
        obj.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAAoBAAAAAABkAAAAAA==", obj.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    Psbt from_b64("cHNidP8BAAoBAAAAAABkAAAAAA==");
    EXPECT_EQ(1, from_b64.GetTransaction().GetVersion());
    EXPECT_EQ(100, from_b64.GetTransaction().GetLockTime());
    EXPECT_EQ(19, from_b64.GetDataSize());
    EXPECT_STREQ("70736274ff01000a0100000000006400000000",
        from_b64.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAAoBAAAAAABkAAAAAA==", from_b64.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
}